

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O0

uint32_t ndn_lite_default_aes_parse_unpadding_size(uint8_t *plaintext_value,uint32_t plaintext_size)

{
  bool bVar1;
  byte local_1f;
  byte local_1d;
  uint8_t j;
  _Bool satisfy;
  uint8_t i;
  uint32_t plaintext_size_local;
  uint8_t *plaintext_value_local;
  
  local_1d = 0;
  while( true ) {
    if (0xf < local_1d) {
      return plaintext_size;
    }
    if (plaintext_value[(ulong)plaintext_size - 1] == byte[local_1d]) break;
    local_1d = local_1d + 1;
  }
  bVar1 = true;
  for (local_1f = 0; local_1f < byte[local_1d]; local_1f = local_1f + 1) {
    if (plaintext_value[((ulong)plaintext_size - 1) - (long)(int)(uint)local_1d] != byte[local_1d])
    {
      bVar1 = false;
    }
  }
  plaintext_value_local._4_4_ = plaintext_size;
  if (bVar1) {
    plaintext_value_local._4_4_ = (plaintext_size - local_1d) - 1;
  }
  return plaintext_value_local._4_4_;
}

Assistant:

uint32_t
ndn_lite_default_aes_parse_unpadding_size(uint8_t* plaintext_value, uint32_t plaintext_size)
{
  for (uint8_t i = 0; i < TC_AES_BLOCK_SIZE; i++)
    if (*(plaintext_value + plaintext_size - 1) == byte[i]) {
      bool satisfy = true;
      for (uint8_t j = 0; j < byte[i]; j++) {
        if (*(plaintext_value + plaintext_size - 1 - i) != byte[i]) {
          satisfy = false;
        }
      }
      if (satisfy) {
        return plaintext_size - i - 1;
      }
      else {
        return plaintext_size;
      }
    }
  return plaintext_size;
}